

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

Rectangle * __thiscall
QPDFObjectHandle::getArrayAsRectangle(Rectangle *__return_storage_ptr__,QPDFObjectHandle *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  double *value;
  undefined1 auVar4 [16];
  Array array;
  double items [4];
  QPDFObjectHandle local_98;
  Array local_88;
  pair<bool,_QPDFObjectHandle> local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  as_array(&local_88,this,strict);
  if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    ::qpdf::Array::~Array(&local_88);
    __return_storage_ptr__->urx = 0.0;
    __return_storage_ptr__->ury = 0.0;
    __return_storage_ptr__->llx = 0.0;
    __return_storage_ptr__->lly = 0.0;
  }
  else {
    iVar2 = ::qpdf::Array::size(&local_88);
    if (iVar2 == 4) {
      value = (double *)local_58;
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        ::qpdf::Array::at(&local_70,&local_88,(int)lVar3);
        local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_70.second.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_70.second.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_70.second.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        local_70.second.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_70.second.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        bVar1 = getValueAsNumber(&local_98,value);
        if (!bVar1) {
          __return_storage_ptr__->urx = 0.0;
          __return_storage_ptr__->ury = 0.0;
          __return_storage_ptr__->llx = 0.0;
          __return_storage_ptr__->lly = 0.0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_98.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          goto LAB_001c0dff;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_98.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        value = value + 1;
      }
      auVar4 = minpd(local_48,local_58);
      __return_storage_ptr__->llx = (double)auVar4._0_8_;
      __return_storage_ptr__->lly = (double)auVar4._8_8_;
      auVar4 = maxpd(local_48,local_58);
      __return_storage_ptr__->urx = (double)auVar4._0_8_;
      __return_storage_ptr__->ury = (double)auVar4._8_8_;
    }
    else {
      __return_storage_ptr__->urx = 0.0;
      __return_storage_ptr__->ury = 0.0;
      __return_storage_ptr__->llx = 0.0;
      __return_storage_ptr__->lly = 0.0;
    }
LAB_001c0dff:
    ::qpdf::Array::~Array(&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Rectangle
QPDFObjectHandle::getArrayAsRectangle() const
{
    if (auto array = as_array(strict)) {
        if (array.size() != 4) {
            return {};
        }
        double items[4];
        for (int i = 0; i < 4; ++i) {
            if (auto item = array.at(i).second; !item.getValueAsNumber(items[i])) {
                return {};
            }
        }
        return {
            std::min(items[0], items[2]),
            std::min(items[1], items[3]),
            std::max(items[0], items[2]),
            std::max(items[1], items[3])};
    }
    return {};
}